

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void tcd_free_encode(opj_tcd_t *tcd)

{
  opj_tcd_tile_t *poVar1;
  opj_tcd_tilecomp_t *__ptr;
  opj_tcd_resolution_t *__ptr_00;
  opj_tcd_precinct_t *__ptr_01;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  opj_tcd_precinct_t **ppoVar6;
  long lVar7;
  long lVar8;
  
  poVar1 = tcd->tcd_image->tiles;
  for (lVar4 = 0; __ptr = poVar1->comps, lVar4 < poVar1->numcomps; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; __ptr_00 = __ptr[lVar4].resolutions, lVar3 < __ptr[lVar4].numresolutions;
        lVar3 = lVar3 + 1) {
      for (lVar2 = 0; lVar2 < __ptr_00[lVar3].numbands; lVar2 = lVar2 + 1) {
        ppoVar6 = &__ptr_00[lVar3].bands[lVar2].precincts;
        for (lVar7 = 0; __ptr_01 = *ppoVar6,
            lVar7 < (long)__ptr_00[lVar3].ph * (long)__ptr_00[lVar3].pw; lVar7 = lVar7 + 1) {
          if (__ptr_01[lVar7].incltree != (opj_tgt_tree_t *)0x0) {
            tgt_destroy(__ptr_01[lVar7].incltree);
            __ptr_01[lVar7].incltree = (opj_tgt_tree_t *)0x0;
          }
          if (__ptr_01[lVar7].imsbtree != (opj_tgt_tree_t *)0x0) {
            tgt_destroy(__ptr_01[lVar7].imsbtree);
            __ptr_01[lVar7].imsbtree = (opj_tgt_tree_t *)0x0;
          }
          lVar5 = 0;
          for (lVar8 = 0; lVar8 < (long)__ptr_01[lVar7].ch * (long)__ptr_01[lVar7].cw;
              lVar8 = lVar8 + 1) {
            free((void *)(*(long *)((long)&(__ptr_01[lVar7].cblks.enc)->data + lVar5) + -2));
            free(*(void **)((long)&(__ptr_01[lVar7].cblks.enc)->layers + lVar5));
            free(*(void **)((long)&(__ptr_01[lVar7].cblks.enc)->passes + lVar5));
            lVar5 = lVar5 + 0x40;
          }
          free(__ptr_01[lVar7].cblks.enc);
        }
        free(__ptr_01);
        *ppoVar6 = (opj_tcd_precinct_t *)0x0;
      }
    }
    free(__ptr_00);
    __ptr[lVar4].resolutions = (opj_tcd_resolution_t *)0x0;
  }
  free(__ptr);
  poVar1->comps = (opj_tcd_tilecomp_t *)0x0;
  free(tcd->tcd_image->tiles);
  tcd->tcd_image->tiles = (opj_tcd_tile_t *)0x0;
  return;
}

Assistant:

void tcd_free_encode(opj_tcd_t *tcd) {
	int tileno, compno, resno, bandno, precno, cblkno;

	for (tileno = 0; tileno < 1; tileno++) {
		opj_tcd_tile_t *tile = tcd->tcd_image->tiles;

		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];

			for (resno = 0; resno < tilec->numresolutions; resno++) {
				opj_tcd_resolution_t *res = &tilec->resolutions[resno];

				for (bandno = 0; bandno < res->numbands; bandno++) {
					opj_tcd_band_t *band = &res->bands[bandno];

					for (precno = 0; precno < res->pw * res->ph; precno++) {
						opj_tcd_precinct_t *prc = &band->precincts[precno];

						if (prc->incltree != NULL) {
							tgt_destroy(prc->incltree);
							prc->incltree = NULL;
						}
						if (prc->imsbtree != NULL) {
							tgt_destroy(prc->imsbtree);	
							prc->imsbtree = NULL;
						}
						for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
							opj_free(prc->cblks.enc[cblkno].data - 2);
							opj_free(prc->cblks.enc[cblkno].layers);
							opj_free(prc->cblks.enc[cblkno].passes);
						}
						opj_free(prc->cblks.enc);
					} /* for (precno */
					opj_free(band->precincts);
					band->precincts = NULL;
				} /* for (bandno */
			} /* for (resno */
			opj_free(tilec->resolutions);
			tilec->resolutions = NULL;
		} /* for (compno */
		opj_free(tile->comps);
		tile->comps = NULL;
	} /* for (tileno */
	opj_free(tcd->tcd_image->tiles);
	tcd->tcd_image->tiles = NULL;
}